

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

FILE * tplt_open(lemon *lemp)

{
  bool bVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char buf [1000];
  
  pcVar6 = buf;
  if (user_templatename != (char *)0x0) {
    iVar2 = access(user_templatename,4);
    if (iVar2 == -1) {
      pcVar5 = "Can\'t find the parser driver template file \"%s\".\n";
      pcVar6 = user_templatename;
    }
    else {
      pFVar3 = fopen(user_templatename,"rb");
      if (pFVar3 != (FILE *)0x0) {
        return (FILE *)pFVar3;
      }
      pcVar5 = "Can\'t open the template file \"%s\".\n";
      pcVar6 = user_templatename;
    }
LAB_0010a218:
    fprintf(_stderr,pcVar5,pcVar6);
    lemp->errorcnt = lemp->errorcnt + 1;
    return (FILE *)0x0;
  }
  pcVar5 = lemp->filename;
  pcVar4 = strrchr(pcVar5,0x2e);
  if (pcVar4 == (char *)0x0) {
    sprintf(buf,"%s.lt",pcVar5);
  }
  else {
    sprintf(buf,"%.*s.lt",(ulong)(uint)((int)pcVar4 - (int)pcVar5),pcVar5);
  }
  iVar2 = access(buf,4);
  if (iVar2 != 0) {
    pcVar6 = tplt_open::templatename;
    iVar2 = access(tplt_open::templatename,4);
    if (iVar2 != 0) {
      pcVar6 = pathsearch(lemp->argv0,tplt_open::templatename,0);
      if (pcVar6 == (char *)0x0) {
        pcVar5 = "Can\'t find the parser driver template file \"%s\".\n";
        pcVar6 = tplt_open::templatename;
        goto LAB_0010a218;
      }
      bVar1 = true;
      goto LAB_0010a1da;
    }
  }
  bVar1 = false;
LAB_0010a1da:
  pFVar3 = fopen(pcVar6,"rb");
  if (pFVar3 == (FILE *)0x0) {
    fprintf(_stderr,"Can\'t open the template file \"%s\".\n",tplt_open::templatename);
    if (bVar1) {
      free(pcVar6);
    }
    lemp->errorcnt = lemp->errorcnt + 1;
    pFVar3 = (FILE *)0x0;
  }
  else if (bVar1) {
    free(pcVar6);
  }
  return (FILE *)pFVar3;
}

Assistant:

PRIVATE FILE *tplt_open(struct lemon *lemp)
{
  static char templatename[] = "lempar.c";
  char buf[1000];
  FILE *in;
  char *tpltname;
  char *cp;
  Boolean tpltnameinbuf;

  /* first, see if user specified a template filename on the command line. */
  if (user_templatename != 0) {
    if( access(user_templatename,004)==-1 ){
      fprintf(stderr,"Can't find the parser driver template file \"%s\".\n",
        user_templatename);
      lemp->errorcnt++;
      return 0;
    }
    in = fopen(user_templatename,"rb");
    if( in==0 ){
      fprintf(stderr,"Can't open the template file \"%s\".\n",
              user_templatename);
      lemp->errorcnt++;
      return 0;
    }
    return in;
  }

  cp = strrchr(lemp->filename,'.');
  if( cp ){
    sprintf(buf,"%.*s.lt",(int)(cp-lemp->filename),lemp->filename);
  }else{
    sprintf(buf,"%s.lt",lemp->filename);
  }
  if( access(buf,004)==0 ){
    tpltname = buf;
    tpltnameinbuf = LEMON_TRUE;
  }else if( access(templatename,004)==0 ){
    tpltname = templatename;
    tpltnameinbuf = LEMON_TRUE;
  }else{
    tpltname = pathsearch(lemp->argv0,templatename,0);
    tpltnameinbuf = LEMON_FALSE;
  }
  if( tpltname==0 ){
    fprintf(stderr,"Can't find the parser driver template file \"%s\".\n",
    templatename);
    lemp->errorcnt++;
    return 0;
  }
  in = fopen(tpltname,"rb");
  if( in==0 ){
    fprintf(stderr,"Can't open the template file \"%s\".\n",templatename);
    if (tpltnameinbuf == LEMON_FALSE) free(tpltname);
    lemp->errorcnt++;
    return 0;
  }
  if (tpltnameinbuf == LEMON_FALSE) free(tpltname);
  return in;
}